

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdma.cc
# Opt level: O0

void __thiscall
bsplib::Rdma::get(Rdma *this,int src_pid,Memslot src_slot,size_t src_offset,void *dst,size_t size)

{
  Memblock *pMVar1;
  undefined1 local_a8 [8];
  Action action;
  Memslot dst_slot;
  undefined1 local_58 [8];
  TicToc t;
  size_t size_local;
  void *dst_local;
  size_t src_offset_local;
  Memslot src_slot_local;
  Rdma *pRStack_10;
  int src_pid_local;
  Rdma *this_local;
  
  t.m_nbytes = size;
  size_local = (size_t)dst;
  dst_local = (void *)src_offset;
  src_offset_local = src_slot;
  src_slot_local._4_4_ = src_pid;
  pRStack_10 = this;
  TicToc::TicToc((TicToc *)local_58,GET,0);
  pMVar1 = slot(this,this->m_pid,src_offset_local);
  if ((pMVar1->status & 1) != 0) {
    __assert_fail("!( slot( m_pid, src_slot ).status & Memblock::PUSHED)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wijnand-suijlen[P]bsponmpi/src/rdma.cc"
                  ,0x7a,"void bsplib::Rdma::get(int, Memslot, size_t, void *, size_t)");
  }
  action.size = std::vector<void_*,_std::allocator<void_*>_>::size(&this->m_local_slots);
  std::vector<void_*,_std::allocator<void_*>_>::push_back
            (&this->m_local_slots,(value_type *)&size_local);
  local_a8._0_4_ = GET;
  local_a8._4_4_ = src_slot_local._4_4_;
  action.kind = src_slot_local._4_4_;
  action.target_pid = this->m_pid;
  action.src_pid = 0;
  action._16_8_ = src_offset_local;
  action.src_slot = action.size;
  action.dst_slot = (Memslot)dst_local;
  action.offset = t.m_nbytes;
  ActionBuf::push_back(&this->m_send_actions,(Action *)local_a8);
  TicToc::~TicToc((TicToc *)local_58);
  return;
}

Assistant:

void Rdma::get( int src_pid, Memslot src_slot, size_t src_offset,
        void * dst, size_t size )
{
#ifdef PROFILE
    TicToc t( TicToc::GET );
#endif
    assert( !( slot( m_pid, src_slot ).status & Memblock::PUSHED) );

    Memslot dst_slot = m_local_slots.size();
    m_local_slots.push_back( dst );

    Action action = { Action::GET, src_pid, src_pid, m_pid, 
                      0, src_slot, dst_slot, src_offset, size  };
    m_send_actions.push_back( action );
}